

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_fexupl_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  byte bVar4;
  float16 a;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  float32 fVar8;
  long lVar9;
  float64 fVar10;
  uint uVar11;
  ulong uVar12;
  ulong *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_58;
  float64 afStack_50 [2];
  ulong local_40;
  fpr_t *local_38;
  
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar9 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      a = *(float16 *)((long)(env->active_fpu).fpr + lVar9 * 2 + (ulong)ws * 0x10 + 8);
      fVar8 = float16_to_float32_mips64(a,true,pfVar2);
      uVar16 = fVar8 | 0x80000000;
      if (-1 < (short)a) {
        uVar16 = fVar8;
      }
      *(uint *)((long)afStack_50 + lVar9 * 4 + -8) = uVar16;
      if ((uVar16 & 0x7fffffff) == 0) {
        uVar11 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar11 = (uint)bVar4;
        if ((uVar16 & 0x7f800000) == 0) {
          uVar11 = bVar4 | 0x10;
        }
      }
      uVar6 = ieee_ex_to_mips_mips64(uVar11);
      uVar16 = (env->active_tc).msacsr;
      uVar15 = (uVar16 & 0x1000000) >> 0x18 & uVar11 >> 6;
      uVar14 = 3;
      if ((uVar16 & 0x1000000) == 0) {
        uVar14 = uVar15;
      }
      if (uVar11 < 0x80) {
        uVar14 = uVar15;
      }
      uVar14 = uVar14 | uVar6;
      uVar7 = (uint)((uVar16 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar15 = uVar7 | uVar14;
      uVar11 = uVar6 & 0xfffffffc;
      if ((uVar7 != 0 || (uVar14 & 1) != 0) || (uVar16 & 0x100) != 0) {
        uVar11 = uVar15;
      }
      if ((uVar14 & 2) == 0) {
        uVar11 = uVar15;
      }
      if ((uVar11 & (uVar16 >> 7 & 0x1f | 0x20)) == 0) {
        uVar14 = uVar11 << 0xc;
LAB_008c3361:
        (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar16;
        if (((uVar16 >> 7 & 0x1f | 0x20) & uVar11) != 0) goto LAB_008c337c;
      }
      else {
        if ((uVar16 >> 0x12 & 1) == 0) {
          uVar14 = uVar11 << 0xc | uVar16;
          uVar16 = uVar16 & 0xfff80fff;
          goto LAB_008c3361;
        }
LAB_008c337c:
        fVar8 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)afStack_50 + lVar9 * 4 + -8) = fVar8 & 0xffffffc0 ^ 0x400000 | uVar11;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c20,
                    "void helper_msa_fexupl_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    local_38 = (env->active_fpu).fpr + ws;
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar9 = 2;
    puVar13 = &local_58;
    local_40 = 0x8000000000000000;
    bVar5 = true;
    do {
      bVar17 = bVar5;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = local_38->fs[lVar9];
      fVar10 = float32_to_float64_mips64(fVar8,pfVar2);
      uVar12 = fVar10 | local_40;
      if (-1 < (int)fVar8) {
        uVar12 = fVar10;
      }
      *puVar13 = uVar12;
      if ((uVar12 & 0x7fffffffffffffff) == 0) {
        uVar16 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar16 = (uint)bVar4;
        if ((uVar12 & 0x7ff0000000000000) == 0) {
          uVar16 = bVar4 | 0x10;
        }
      }
      uVar6 = ieee_ex_to_mips_mips64(uVar16);
      uVar11 = (env->active_tc).msacsr;
      uVar15 = (uVar11 & 0x1000000) >> 0x18 & uVar16 >> 6;
      uVar14 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar14 = uVar15;
      }
      if (uVar16 < 0x80) {
        uVar14 = uVar15;
      }
      uVar14 = uVar14 | uVar6;
      uVar7 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar15 = uVar7 | uVar14;
      uVar16 = uVar6 & 0xfffffffc;
      if ((uVar7 != 0 || (uVar14 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar16 = uVar15;
      }
      if ((uVar14 & 2) == 0) {
        uVar16 = uVar15;
      }
      if ((uVar16 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar14 = uVar16 << 0xc;
LAB_008c31ff:
        (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar11;
        if (((uVar11 >> 7 & 0x1f | 0x20) & uVar16) != 0) goto LAB_008c321a;
      }
      else {
        if ((uVar11 >> 0x12 & 1) == 0) {
          uVar14 = uVar16 << 0xc | uVar11;
          uVar11 = uVar11 & 0xfff80fff;
          goto LAB_008c31ff;
        }
LAB_008c321a:
        fVar10 = float64_default_nan_mips64(pfVar2);
        *puVar13 = (long)(int)uVar16 | fVar10 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar9 = 3;
      puVar13 = afStack_50;
      bVar5 = false;
    } while (bVar17);
  }
  uVar16 = (env->active_tc).msacsr;
  uVar11 = uVar16 >> 7 & 0x1f | 0x20;
  if ((uVar11 & uVar16 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar11);
  }
  (env->active_tc).msacsr = (uVar16 >> 0xc & 0x1f) << 2 | uVar16;
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = local_58;
  (&pfVar3->fd)[1] = afStack_50[0];
  return;
}

Assistant:

void helper_msa_fexupl_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                          uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            /*
             * Half precision floats come in two formats: standard
             * IEEE and "ARM" format.  The latter gains extra exponent
             * range by omitting the NaN/Inf encodings.
             */
            flag ieee = 1;

            MSA_FLOAT_BINOP(pwx->w[i], from_float16, Lh(pws, i), ieee, 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_float32, Lw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());
    msa_move_v(pwd, pwx);
}